

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void blend_solid(plutovg_surface_t *surface,plutovg_operator_t op,uint32_t solid,
                plutovg_span_buffer_t *span_buffer)

{
  composition_solid_function_t p_Var1;
  uint32_t *target;
  plutovg_span_t *spans;
  int count;
  composition_solid_function_t func;
  plutovg_span_buffer_t *span_buffer_local;
  uint32_t solid_local;
  plutovg_operator_t op_local;
  plutovg_surface_t *surface_local;
  
  p_Var1 = composition_solid_table[op];
  target = (uint32_t *)(span_buffer->spans).data;
  spans._4_4_ = (span_buffer->spans).size;
  while (spans._4_4_ != 0) {
    (*p_Var1)((uint32_t *)
              (surface->data + (long)(int)*target * 4 + (long)(int)(target[2] * surface->stride)),
              target[1],solid,(uint32_t)(char)target[3]);
    target = target + 4;
    spans._4_4_ = spans._4_4_ + -1;
  }
  return;
}

Assistant:

static void blend_solid(plutovg_surface_t* surface, plutovg_operator_t op, uint32_t solid, const plutovg_span_buffer_t* span_buffer)
{
    composition_solid_function_t func = composition_solid_table[op];
    int count = span_buffer->spans.size;
    const plutovg_span_t* spans = span_buffer->spans.data;
    while(count--) {
        uint32_t* target = (uint32_t*)(surface->data + spans->y * surface->stride) + spans->x;
        func(target, spans->len, solid, spans->coverage);
        ++spans;
    }
}